

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O0

ostream * deqp::gles3::Functional::operator<<(ostream *str,HexBool *v)

{
  ostream *poVar1;
  Hex<8UL> hex;
  char *pcVar2;
  HexBool *v_local;
  ostream *str_local;
  
  pcVar2 = "false";
  if (v->value != 0) {
    pcVar2 = "true";
  }
  poVar1 = std::operator<<(str,pcVar2);
  poVar1 = std::operator<<(poVar1," / ");
  hex = tcu::toHex<unsigned_int>(v->value);
  poVar1 = tcu::Format::operator<<(poVar1,hex);
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const HexBool& v)
{
	return str << (v.value ? "true" : "false") << " / " << tcu::toHex(v.value);
}